

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O2

flatcc_builder_ref_t flatcc_builder_end_offset_vector(flatcc_builder_t *B)

{
  flatcc_builder_ref_t fVar1;
  
  if (B->frame->type == 5) {
    fVar1 = flatcc_builder_create_offset_vector_direct
                      (B,(flatcc_builder_ref_t *)B->ds,(ulong)(B->frame->container).table.pl_end);
    if (fVar1 != 0) {
      exit_frame(B);
    }
    return fVar1;
  }
  __assert_fail("(B->frame[0].type) == flatcc_builder_offset_vector",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x5e7,"flatcc_builder_ref_t flatcc_builder_end_offset_vector(flatcc_builder_t *)");
}

Assistant:

flatcc_builder_ref_t flatcc_builder_end_offset_vector(flatcc_builder_t *B)
{
    flatcc_builder_ref_t vector_ref;

    check(frame(type) == flatcc_builder_offset_vector, "expected offset vector frame");
    if (0 == (vector_ref = flatcc_builder_create_offset_vector_direct(B,
            (flatcc_builder_ref_t *)B->ds, frame(container.vector.count)))) {
        return 0;
    }
    exit_frame(B);
    return vector_ref;
}